

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O2

void __thiscall
ElementsConfidentialAddress_P2shWrappedP2wpkhAddress_Test::
~ElementsConfidentialAddress_P2shWrappedP2wpkhAddress_Test
          (ElementsConfidentialAddress_P2shWrappedP2wpkhAddress_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2shWrappedP2wpkhAddress) {
  const Pubkey pubkey = Pubkey(
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  // locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
  ByteData160 pubkey_hash = HashUtil::Hash160(pubkey);
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_0);
  builder.AppendData(pubkey_hash);
  const Script &script = builder.Build();
  ConfidentialKey key = ConfidentialKey(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16");
  ElementsConfidentialAddress address;
  Address unblind_addr;

  unblind_addr = Address(ElementsNetType::kLiquidV1, script, GetElementsAddressFormatList());
  EXPECT_NO_THROW((address = ElementsConfidentialAddress(unblind_addr, key)));
  EXPECT_STREQ(
      "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnYHZSM3ydLeZvFxSQ1MK8cXrXdQYVwx3i1",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("19970f64fb36fe3b7b21eca335ff70dde51eb8c8",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("GjWqFsdByr7TVs1SFiMmAaFwgSPAz5xzQm",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kLiquidV1, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2shAddress, address.GetAddressType());

  unblind_addr = Address(ElementsNetType::kElementsRegtest, script, GetElementsAddressFormatList());
  EXPECT_NO_THROW((address = ElementsConfidentialAddress(unblind_addr, key)));
  EXPECT_STREQ(
      "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBZpEpP4oQSsdKNVYZmDtn7qLEyXoK7qUrY",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("19970f64fb36fe3b7b21eca335ff70dde51eb8c8",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("XDgYhnMZYLnzwU2Z8pMEd64GLbf8W9A5vA",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2shAddress, address.GetAddressType());
}